

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGenerator::AddInstallNamePatchRule
          (cmInstallTargetGenerator *this,ostream *os,Indent indent,string *config,
          string *toDestDirPath)

{
  pointer pcVar1;
  cmGeneratorTarget *this_00;
  cmInstallTargetGenerator *pcVar2;
  cmInstallTargetGenerator *pcVar3;
  bool bVar4;
  TargetType TVar5;
  int iVar6;
  cmMakefile *this_01;
  string *psVar7;
  cmComputeLinkInformation *this_02;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *psVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  ostream *poVar11;
  _Alloc_hider _Var12;
  Indent IVar13;
  string new_id;
  string fname;
  string for_install;
  string installNameTool;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  install_name_remap;
  string local_110;
  string local_f0;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0 [2];
  undefined1 local_90 [32];
  _Rb_tree_node_base *local_70;
  size_t local_68;
  string *local_60;
  cmInstallTargetGenerator *local_58;
  string local_50;
  
  if ((this->ImportLibrary == false) &&
     (((local_60 = toDestDirPath, TVar5 = cmGeneratorTarget::GetType(this->Target),
       TVar5 == SHARED_LIBRARY ||
       (TVar5 = cmGeneratorTarget::GetType(this->Target), TVar5 == MODULE_LIBRARY)) ||
      (TVar5 = cmGeneratorTarget::GetType(this->Target), TVar5 == EXECUTABLE)))) {
    this_01 = cmTarget::GetMakefile(this->Target->Target);
    local_90._0_8_ = local_90 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"CMAKE_INSTALL_NAME_TOOL","")
    ;
    psVar7 = cmMakefile::GetSafeDefinition(this_01,(string *)local_90);
    local_b0 = local_a0;
    pcVar1 = (psVar7->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + psVar7->_M_string_length);
    if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
    if (local_a8 != 0) {
      local_90._24_8_ = local_90 + 8;
      local_90._8_4_ = _S_red;
      local_90._16_8_ = 0;
      local_68 = 0;
      local_70 = (_Rb_tree_node_base *)local_90._24_8_;
      this_02 = cmGeneratorTarget::GetLinkInformation(this->Target,config);
      pcVar2 = local_58;
      if (this_02 != (cmComputeLinkInformation *)0x0) {
        psVar8 = cmComputeLinkInformation::GetSharedLibrariesLinked(this_02);
        p_Var10 = (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        pcVar3 = this;
        pcVar2 = local_58;
        while (local_58 = pcVar3,
              (_Rb_tree_header *)p_Var10 != &(psVar8->_M_t)._M_impl.super__Rb_tree_header) {
          this_00 = *(cmGeneratorTarget **)(p_Var10 + 1);
          bVar4 = cmGeneratorTarget::IsImported(this_00);
          if (!bVar4) {
            cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_110,this_00,config);
            cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_d0,this_00);
            _Var12._M_p = local_d0._M_dataplus._M_p;
            if ((local_110._M_string_length != local_d0._M_string_length) ||
               ((local_110._M_string_length != 0 &&
                (iVar6 = bcmp(local_110._M_dataplus._M_p,local_d0._M_dataplus._M_p,
                              local_110._M_string_length), iVar6 != 0)))) {
              GetInstallFilename(&local_f0,this_00,config,NameSO);
              std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_f0._M_dataplus._M_p);
              std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
              pmVar9 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)local_90,&local_110);
              std::__cxx11::string::_M_assign((string *)pmVar9);
              _Var12._M_p = local_d0._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
                _Var12._M_p = local_d0._M_dataplus._M_p;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var12._M_p != &local_d0.field_2) {
              operator_delete(_Var12._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            this = local_58;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,
                              CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                       local_110.field_2._M_local_buf[0]) + 1);
              this = local_58;
            }
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          pcVar3 = local_58;
          pcVar2 = local_58;
        }
      }
      local_58 = pcVar2;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_local_buf[0] = '\0';
      TVar5 = cmGeneratorTarget::GetType(this->Target);
      if (TVar5 == SHARED_LIBRARY) {
        cmGeneratorTarget::GetInstallNameDirForBuildTree(&local_d0,this->Target,config);
        cmGeneratorTarget::GetInstallNameDirForInstallTree_abi_cxx11_(&local_f0,this->Target);
        cmGeneratorTarget::IsFrameworkOnApple(this->Target);
        _Var12._M_p = local_f0._M_dataplus._M_p;
        if ((local_d0._M_string_length != local_f0._M_string_length) ||
           ((local_d0._M_string_length != 0 &&
            (iVar6 = bcmp(local_d0._M_dataplus._M_p,local_f0._M_dataplus._M_p,
                          local_d0._M_string_length), iVar6 != 0)))) {
          std::__cxx11::string::_M_assign((string *)&local_110);
          GetInstallFilename(&local_50,this->Target,config,NameSO);
          std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_50._M_dataplus._M_p);
          _Var12._M_p = local_f0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
            _Var12._M_p = local_f0._M_dataplus._M_p;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var12._M_p != &local_f0.field_2) {
          operator_delete(_Var12._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_68 != 0 || local_110._M_string_length != 0) {
        IVar13.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            IVar13.Level = IVar13.Level + -1;
          } while (IVar13.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"execute_process(COMMAND \"",0x19);
        std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_b0,local_a8);
        std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
        if (local_110._M_string_length != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          IVar13.Level = indent.Level;
          if (0 < indent.Level) {
            do {
              std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
              IVar13.Level = IVar13.Level + -1;
            } while (IVar13.Level != 0);
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"  -id \"",7);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (os,local_110._M_dataplus._M_p,local_110._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
        }
        p_Var10 = (_Rb_tree_node_base *)local_90._24_8_;
        if ((_Rb_tree_node_base *)local_90._24_8_ != (_Rb_tree_node_base *)(local_90 + 8)) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
            IVar13.Level = indent.Level;
            if (0 < indent.Level) {
              do {
                std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
                IVar13.Level = IVar13.Level + -1;
              } while (IVar13.Level != 0);
            }
            std::__ostream_insert<char,std::char_traits<char>>(os,"  -change \"",0xb);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (os,*(char **)(p_Var10 + 1),(long)p_Var10[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" \"",3);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,*(char **)(p_Var10 + 2),(long)p_Var10[2]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\"",1);
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          } while (p_Var10 != (_Rb_tree_node_base *)(local_90 + 8));
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
            indent.Level = indent.Level + -1;
          } while (indent.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"  \"",3);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (os,(local_60->_M_dataplus)._M_p,local_60->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\")\n",3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_90);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  return;
}

Assistant:

void cmInstallTargetGenerator::AddInstallNamePatchRule(
  std::ostream& os, Indent indent, const std::string& config,
  std::string const& toDestDirPath)
{
  if (this->ImportLibrary ||
      !(this->Target->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->Target->GetType() == cmStateEnums::MODULE_LIBRARY ||
        this->Target->GetType() == cmStateEnums::EXECUTABLE)) {
    return;
  }

  // Fix the install_name settings in installed binaries.
  std::string installNameTool =
    this->Target->Target->GetMakefile()->GetSafeDefinition(
      "CMAKE_INSTALL_NAME_TOOL");

  if (installNameTool.empty()) {
    return;
  }

  // Build a map of build-tree install_name to install-tree install_name for
  // shared libraries linked to this target.
  std::map<std::string, std::string> install_name_remap;
  if (cmComputeLinkInformation* cli =
        this->Target->GetLinkInformation(config)) {
    std::set<cmGeneratorTarget const*> const& sharedLibs =
      cli->GetSharedLibrariesLinked();
    for (cmGeneratorTarget const* tgt : sharedLibs) {
      // The install_name of an imported target does not change.
      if (tgt->IsImported()) {
        continue;
      }

      // If the build tree and install tree use different path
      // components of the install_name field then we need to create a
      // mapping to be applied after installation.
      std::string for_build = tgt->GetInstallNameDirForBuildTree(config);
      std::string for_install = tgt->GetInstallNameDirForInstallTree();
      if (for_build != for_install) {
        // The directory portions differ.  Append the filename to
        // create the mapping.
        std::string fname = this->GetInstallFilename(tgt, config, NameSO);

        // Map from the build-tree install_name.
        for_build += fname;

        // Map to the install-tree install_name.
        for_install += fname;

        // Store the mapping entry.
        install_name_remap[for_build] = for_install;
      }
    }
  }

  // Edit the install_name of the target itself if necessary.
  std::string new_id;
  if (this->Target->GetType() == cmStateEnums::SHARED_LIBRARY) {
    std::string for_build =
      this->Target->GetInstallNameDirForBuildTree(config);
    std::string for_install = this->Target->GetInstallNameDirForInstallTree();

    if (this->Target->IsFrameworkOnApple() && for_install.empty()) {
      // Frameworks seem to have an id corresponding to their own full
      // path.
      // ...
      // for_install = fullDestPath_without_DESTDIR_or_name;
    }

    // If the install name will change on installation set the new id
    // on the installed file.
    if (for_build != for_install) {
      // Prepare to refer to the install-tree install_name.
      new_id = for_install;
      new_id += this->GetInstallFilename(this->Target, config, NameSO);
    }
  }

  // Write a rule to run install_name_tool to set the install-tree
  // install_name value and references.
  if (!new_id.empty() || !install_name_remap.empty()) {
    os << indent << "execute_process(COMMAND \"" << installNameTool;
    os << "\"";
    if (!new_id.empty()) {
      os << "\n" << indent << "  -id \"" << new_id << "\"";
    }
    for (auto const& i : install_name_remap) {
      os << "\n"
         << indent << "  -change \"" << i.first << "\" \"" << i.second << "\"";
    }
    os << "\n" << indent << "  \"" << toDestDirPath << "\")\n";
  }
}